

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

void __thiscall rcg::Stream::attachBuffers(Stream *this,bool enable)

{
  void *pvVar1;
  undefined7 in_register_00000031;
  shared_ptr<GenApi_3_4::CNodeMapRef> rnodemap;
  shared_ptr<GenApi_3_4::CNodeMapRef> local_68;
  string local_58;
  shared_ptr<GenApi_3_4::CNodeMapRef> local_38;
  element_type *local_20;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  if ((int)CONCAT71(in_register_00000031,enable) == 0) {
    local_38.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
    Buffer::setNodemap(&this->buffer,&local_38,&local_58);
    local_18._M_pi =
         local_38.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      local_18._M_pi =
           local_38.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    }
  }
  else {
    pvVar1 = Device::getHandle((this->parent).
                               super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (pvVar1 == (void *)0x0) {
      return;
    }
    Device::getRemoteNodeMap
              ((Device *)&stack0xffffffffffffffe0,
               (char *)(this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
    local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_20;
    local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_18._M_pi;
    if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      }
    }
    Device::getTLType_abi_cxx11_
              (&local_58,
               (this->parent).super___shared_ptr<rcg::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Buffer::setNodemap(&this->buffer,&local_68,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
  }
  return;
}

Assistant:

void Stream::attachBuffers(bool enable)
{
  if (enable)
  {
    if (parent->getHandle() != 0)
    {
      std::shared_ptr<GenApi::CNodeMapRef> rnodemap=parent->getRemoteNodeMap();
      buffer.setNodemap(rnodemap, parent->getTLType());
    }
  }
  else
  {
    buffer.setNodemap(0, "");
  }
}